

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

int Saig_StrSimDetectUnique(Aig_Man_t *p0,Aig_Man_t *p1)

{
  uint uVar1;
  Aig_Obj_t **ppTable;
  Aig_Obj_t **ppNexts;
  void *__ptr;
  Aig_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  uint uVar8;
  uint nTableSize;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  
  pVVar10 = p0->vObjs;
  iVar9 = pVVar10->nSize;
  nTableSize = (iVar9 - p0->nDeleted) / 2 - 1;
  while( true ) {
    do {
      uVar8 = nTableSize;
      nTableSize = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (nTableSize < 9) break;
    iVar3 = 5;
    while (nTableSize % (iVar3 - 2U) != 0) {
      uVar1 = iVar3 * iVar3;
      iVar3 = iVar3 + 2;
      if (nTableSize < uVar1) goto LAB_006f5eab;
    }
  }
LAB_006f5eab:
  ppTable = (Aig_Obj_t **)calloc((long)(int)nTableSize,8);
  ppNexts = (Aig_Obj_t **)calloc((long)iVar9,8);
  __ptr = calloc((long)iVar9,8);
  if (0 < iVar9) {
    lVar7 = 0;
LAB_006f5f01:
    pAVar6 = (Aig_Obj_t *)pVVar10->pArray[lVar7];
    if (((pAVar6 != (Aig_Obj_t *)0x0) &&
        ((uVar1 = (uint)*(undefined8 *)&pAVar6->field_0x18, (uVar1 & 7) == 2 ||
         (0xfffffffd < (uVar1 & 7) - 7)))) &&
       ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar6->Id] == (Aig_Obj_t *)0x0)))) {
      lVar4 = 0;
      do {
        if (*(int *)((long)(pAVar6->field_5).pData + lVar4 * 4) != 0) {
          lVar4 = 0;
          goto LAB_006f5f5b;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
    }
    goto LAB_006f5fa6;
  }
LAB_006f5fba:
  pVVar10 = p1->vObjs;
  if (pVVar10->nSize < 1) {
LAB_006f6090:
    iVar9 = 0;
    if (uVar8 < 0x7fffffff) {
      uVar5 = 0;
      iVar9 = 0;
      do {
        pAVar6 = ppTable[uVar5];
        while (pAVar6 != (Aig_Obj_t *)0x0) {
          lVar7 = (long)pAVar6->Id;
          if ((((*(ulong *)&pAVar6->field_0x18 & 0x10) == 0) &&
              (pAVar2 = *(Aig_Obj_t **)((long)__ptr + lVar7 * 8), pAVar2 != (Aig_Obj_t *)0x0)) &&
             ((((uint)*(ulong *)&pAVar6->field_0x18 ^ *(uint *)&pAVar2->field_0x18) & 7) == 0)) {
            if (p0->pReprs == (Aig_Obj_t **)0x0) {
LAB_006f6146:
              __assert_fail("p->pReprs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
            }
            p0->pReprs[lVar7] = pAVar2;
            if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006f6146;
            p1->pReprs[pAVar2->Id] = pAVar6;
            iVar9 = iVar9 + 1;
          }
          pAVar6 = ppNexts[lVar7];
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != nTableSize);
    }
    Aig_ManCleanMarkA(p0);
    if (ppTable != (Aig_Obj_t **)0x0) {
      free(ppTable);
    }
    if (ppNexts != (Aig_Obj_t **)0x0) {
      free(ppNexts);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    return iVar9;
  }
  lVar7 = 0;
LAB_006f5fcb:
  pAVar6 = (Aig_Obj_t *)pVVar10->pArray[lVar7];
  if (((pAVar6 != (Aig_Obj_t *)0x0) &&
      ((uVar1 = (uint)*(undefined8 *)&pAVar6->field_0x18, (uVar1 & 7) == 2 ||
       (0xfffffffd < (uVar1 & 7) - 7)))) &&
     ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar6->Id] == (Aig_Obj_t *)0x0)))) {
    lVar4 = 0;
    do {
      if (*(int *)((long)(pAVar6->field_5).pData + lVar4 * 4) != 0) {
        lVar4 = 0;
        goto LAB_006f6029;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  goto LAB_006f6080;
  while (lVar4 = lVar4 + 1, lVar4 != 0x10) {
LAB_006f5f5b:
    if (*(int *)((long)(pAVar6->field_5).pData + lVar4 * 4) != -1) {
      pAVar2 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar6);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        Saig_StrSimTableInsert(ppTable,ppNexts,nTableSize,pAVar6);
      }
      else {
        pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
      }
      break;
    }
  }
LAB_006f5fa6:
  lVar7 = lVar7 + 1;
  pVVar10 = p0->vObjs;
  if (pVVar10->nSize <= lVar7) goto LAB_006f5fba;
  goto LAB_006f5f01;
  while (lVar4 = lVar4 + 1, lVar4 != 0x10) {
LAB_006f6029:
    if (*(int *)((long)(pAVar6->field_5).pData + lVar4 * 4) != -1) {
      pAVar2 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar6);
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        if (*(long *)((long)__ptr + (long)pAVar2->Id * 8) == 0) {
          *(Aig_Obj_t **)((long)__ptr + (long)pAVar2->Id * 8) = pAVar6;
        }
        else {
          pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
          pVVar10 = p1->vObjs;
        }
      }
      break;
    }
  }
LAB_006f6080:
  lVar7 = lVar7 + 1;
  if (pVVar10->nSize <= lVar7) goto LAB_006f6090;
  goto LAB_006f5fcb;
}

Assistant:

int Saig_StrSimDetectUnique( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppCands;
    Aig_Obj_t * pObj, * pEntry;
    int i, nTableSize, Counter;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNum(p0)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );
    ppCands = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );

    // hash nodes of the first AIG
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p0, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // insert
            Saig_StrSimTableInsert( ppTable, ppNexts, nTableSize, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // hash nodes from the second AIG
    Aig_ManForEachObj( p1, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p1, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // skip
            continue;
        // if there is no candidate, label it
        if ( Saig_ObjNext( ppCands, pEntry ) == NULL )
            Saig_ObjSetNext( ppCands, pEntry, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // create representatives for the unique entries
    Counter = 0;
    for ( i = 0; i < nTableSize; i++ )
        for ( pEntry = ppTable[i]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
            if ( !pEntry->fMarkA && (pObj = Saig_ObjNext( ppCands, pEntry )) )
            {
//                assert( Aig_ObjIsNode(pEntry) == Aig_ObjIsNode(pObj) );
                if ( Aig_ObjType(pEntry) != Aig_ObjType(pObj) )
                    continue;
                Aig_ObjSetRepr( p0, pEntry, pObj );
                Aig_ObjSetRepr( p1, pObj, pEntry );
                Counter++;
            }

    // cleanup
    Aig_ManCleanMarkA( p0 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    ABC_FREE( ppCands );
    return Counter;
}